

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng_inflatev(ucvector *out,uchar *in,size_t insize,LodePNGDecompressSettings *settings)

{
  uchar *puVar1;
  ushort uVar2;
  int iVar3;
  uchar *puVar4;
  size_t sVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint *bitlen;
  uint *bitlen_00;
  uint *puVar9;
  byte bVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  unsigned_short *puVar14;
  unsigned_short *puVar15;
  uint *puVar16;
  int iVar17;
  ulong uVar18;
  HuffmanTree *codetree;
  ulong __n;
  long lVar19;
  ulong uVar20;
  uint *puVar21;
  long lVar22;
  long lVar23;
  HuffmanTree tree_ll;
  int local_138;
  LodePNGBitReader local_130;
  uint *local_108;
  uint local_fc;
  unsigned_short *local_f8;
  HuffmanTree *local_f0;
  ulong local_e8;
  uint local_e0;
  uint local_dc;
  long local_d8;
  ucvector *local_d0;
  unsigned_short *local_c8;
  LodePNGDecompressSettings *local_c0;
  HuffmanTree local_b8;
  HuffmanTree local_88;
  HuffmanTree local_58;
  
  local_130.bitsize = insize * 8;
  uVar6 = 0x69;
  if (local_130.bitsize < 0xffffffffffffffc0 && insize >> 0x3d == 0) {
    local_130.bp = 0;
    local_130.buffer = 0;
    uVar12 = 0;
    local_130.data = in;
    local_130.size = insize;
    local_c0 = settings;
    do {
      if (uVar12 != 0) {
        return 0;
      }
      uVar6 = ensureBits9(&local_130,3);
      sVar5 = local_130.size;
      puVar4 = local_130.data;
      if (uVar6 == 0) {
        return 0x34;
      }
      uVar12 = local_130.buffer >> 3;
      uVar13 = local_130.bp + 3;
      uVar6 = local_130.buffer >> 1 & 3;
      local_dc = local_130.buffer;
      local_130.buffer = uVar12;
      if (uVar6 == 0) {
        uVar18 = local_130.bp + 10 >> 3;
        uVar20 = uVar18 + 4;
        if (local_130.size <= uVar20) {
          return 0x34;
        }
        uVar2 = *(ushort *)(local_130.data + uVar18);
        __n = (ulong)uVar2;
        if ((local_c0->ignore_nlen == 0) &&
           ((uint)*(ushort *)(local_130.data + uVar18 + 2) + (uint)uVar2 != 0xffff)) {
          return 0x15;
        }
        local_130.bp = uVar13;
        uVar6 = ucvector_resize(out,out->size + __n);
        if (uVar6 == 0) {
          return 0x53;
        }
        if (sVar5 < uVar20 + __n) {
          return 0x17;
        }
        if (uVar2 != 0) {
          memcpy(out->data + (out->size - __n),puVar4 + uVar20,__n);
        }
        local_130.bp = (uVar20 + __n) * 8;
        uVar6 = 0;
      }
      else {
        if (uVar6 == 3) {
          return 0x14;
        }
        local_88.codes = (uint *)0x0;
        local_88.lengths = (uint *)0x0;
        local_88.table_len = (uchar *)0x0;
        local_88.table_value = (unsigned_short *)0x0;
        local_b8.codes = (uint *)0x0;
        local_b8.lengths = (uint *)0x0;
        local_b8.table_len = (uchar *)0x0;
        local_b8.table_value = (unsigned_short *)0x0;
        if (uVar6 == 1) {
          local_130.bp = uVar13;
          uVar6 = generateFixedLitLenTree(&local_88);
          if (uVar6 == 0) {
            uVar6 = generateFixedDistanceTree(&local_b8);
            goto LAB_0011b93c;
          }
        }
        else {
          local_130.bp = uVar13;
          uVar12 = ensureBits17(&local_130,0xe);
          uVar6 = local_130.buffer;
          if (uVar12 == 0) {
            uVar6 = 0x31;
          }
          else {
            local_130.buffer = local_130.buffer >> 0xe;
            uVar13 = local_130.bp + 0xe;
            local_130.bp = uVar13;
            bitlen = (uint *)malloc(0x4c);
            if (bitlen == (uint *)0x0) {
              uVar6 = 0x53;
            }
            else {
              uVar18 = (ulong)(uVar6 >> 10 & 0xf);
              local_58.codes = (uint *)0x0;
              local_58.lengths = (uint *)0x0;
              local_58.table_len = (uchar *)0x0;
              local_58.table_value = (unsigned_short *)0x0;
              uVar20 = (uVar18 + 4) * 3 + uVar13;
              if ((uVar20 < uVar13) || (local_130.bitsize < uVar20)) {
                bitlen_00 = (uint *)0x0;
                puVar9 = (uint *)0x0;
                uVar6 = 0x32;
              }
              else {
                local_e8 = (ulong)(uVar6 & 0x1f);
                local_f8 = (unsigned_short *)(local_e8 + 0x101);
                local_108 = (uint *)(ulong)((uVar6 >> 5 & 0x1f) + 1);
                lVar19 = 0;
                local_d0 = out;
                do {
                  ensureBits9(&local_130,3);
                  uVar6 = local_130.buffer & 7;
                  local_130.buffer = local_130.buffer >> 3;
                  uVar13 = local_130.bp + 3;
                  bitlen[*(uint *)((long)CLCL_ORDER + lVar19)] = uVar6;
                  lVar19 = lVar19 + 4;
                  local_130.bp = uVar13;
                } while (uVar18 * 4 + 0x10 != lVar19);
                local_138 = (int)(uVar18 + 4);
                if (local_138 != 0x13) {
                  do {
                    bitlen[CLCL_ORDER[uVar18 + 4]] = 0;
                    uVar18 = uVar18 + 1;
                  } while (uVar18 != 0xf);
                }
                uVar6 = HuffmanTree_makeFromLengths(&local_58,bitlen,0x13,7);
                out = local_d0;
                if (uVar6 == 0) {
                  bitlen_00 = (uint *)malloc(0x480);
                  puVar9 = (uint *)malloc(0x80);
                  if (puVar9 == (uint *)0x0 || bitlen_00 == (uint *)0x0) {
                    uVar6 = 0x53;
                  }
                  else {
                    uVar7 = 0;
                    memset(bitlen_00,0,0x480);
                    puVar9[0] = 0;
                    puVar9[1] = 0;
                    puVar9[2] = 0;
                    puVar9[3] = 0;
                    puVar9[4] = 0;
                    puVar9[5] = 0;
                    puVar9[6] = 0;
                    puVar9[7] = 0;
                    puVar9[8] = 0;
                    puVar9[9] = 0;
                    puVar9[10] = 0;
                    puVar9[0xb] = 0;
                    puVar9[0xc] = 0;
                    puVar9[0xd] = 0;
                    puVar9[0xe] = 0;
                    puVar9[0xf] = 0;
                    puVar9[0x10] = 0;
                    puVar9[0x11] = 0;
                    puVar9[0x12] = 0;
                    puVar9[0x13] = 0;
                    puVar9[0x14] = 0;
                    puVar9[0x15] = 0;
                    puVar9[0x16] = 0;
                    puVar9[0x17] = 0;
                    puVar9[0x18] = 0;
                    puVar9[0x19] = 0;
                    puVar9[0x1a] = 0;
                    puVar9[0x1b] = 0;
                    puVar9[0x1c] = 0;
                    puVar9[0x1d] = 0;
                    puVar9[0x1e] = 0;
                    puVar9[0x1f] = 0;
                    uVar12 = (int)local_108 + (int)local_f8;
                    puVar14 = (unsigned_short *)(ulong)uVar12;
                    local_f0 = (HuffmanTree *)local_58.table_len;
                    local_c8 = local_58.table_value;
                    local_e0 = (int)local_e8 + 0x102;
                    uVar6 = -(int)local_e8;
                    local_e8 = (ulong)uVar6;
                    local_d8 = (long)(int)uVar6 + -0x101;
                    local_fc = 0;
                    local_108 = puVar9;
                    do {
                      uVar20 = uVar13 >> 3;
                      if (uVar20 + 3 < local_130.size) {
                        local_130.buffer = *(uint *)(local_130.data + uVar20);
                      }
                      else {
                        local_130.buffer = 0;
                        if (uVar20 < local_130.size) {
                          local_130.buffer = (uint)local_130.data[uVar20];
                        }
                        if (uVar20 + 1 < local_130.size) {
                          local_130.buffer =
                               local_130.buffer | (uint)local_130.data[uVar20 + 1] << 8;
                        }
                        if (uVar20 + 2 < local_130.size) {
                          local_130.buffer =
                               local_130.buffer | (uint)local_130.data[uVar20 + 2] << 0x10;
                        }
                      }
                      local_130.buffer = local_130.buffer >> ((byte)uVar13 & 7);
                      uVar6 = huffmanDecodeSymbol(&local_130,local_f0);
                      puVar9 = local_108;
                      if (uVar6 < 0x10) {
                        uVar11 = (uint)local_f8;
                        puVar16 = local_108;
                        if (uVar7 < uVar11) {
                          uVar11 = 0;
                          puVar16 = bitlen_00;
                        }
                        puVar16[uVar7 - uVar11] = uVar6;
                        uVar7 = uVar7 + 1;
                      }
                      else {
                        iVar3 = (int)local_d8;
                        if (uVar6 == 0x12) {
                          uVar6 = local_130.buffer & 0x7f;
                          local_130.buffer = local_130.buffer >> 7;
                          local_130.bp = local_130.bp + 7;
                          puVar15 = (unsigned_short *)(ulong)uVar7;
                          iVar17 = -uVar7;
                          puVar16 = bitlen_00 + (long)puVar15;
                          iVar8 = uVar6 + 0xb;
                          do {
                            if (puVar14 <= puVar15) {
                              uVar7 = -iVar17;
                              local_fc = 0xf;
                              goto LAB_0011bf67;
                            }
                            puVar21 = local_108 + (uint)(iVar3 + (int)puVar15);
                            if (puVar15 < local_f8) {
                              puVar21 = puVar16;
                            }
                            *puVar21 = 0;
                            puVar15 = (unsigned_short *)((long)puVar15 + 1);
                            iVar17 = iVar17 + -1;
                            puVar16 = puVar16 + 1;
                            iVar8 = iVar8 + -1;
                          } while (iVar8 != 0);
                        }
                        else if (uVar6 == 0x11) {
                          uVar6 = local_130.buffer & 7;
                          local_130.buffer = local_130.buffer >> 3;
                          local_130.bp = local_130.bp + 3;
                          puVar15 = (unsigned_short *)(ulong)uVar7;
                          iVar17 = -uVar7;
                          puVar16 = bitlen_00 + (long)puVar15;
                          iVar8 = uVar6 + 3;
                          do {
                            if (puVar14 <= puVar15) {
                              uVar7 = -iVar17;
                              local_fc = 0xe;
                              goto LAB_0011bf67;
                            }
                            puVar21 = local_108 + (uint)(iVar3 + (int)puVar15);
                            if (puVar15 < local_f8) {
                              puVar21 = puVar16;
                            }
                            *puVar21 = 0;
                            puVar15 = (unsigned_short *)((long)puVar15 + 1);
                            iVar17 = iVar17 + -1;
                            puVar16 = puVar16 + 1;
                            iVar8 = iVar8 + -1;
                          } while (iVar8 != 0);
                        }
                        else {
                          if (uVar6 != 0x10) {
                            uVar6 = 0x10;
                            goto LAB_0011b917;
                          }
                          if (uVar7 == 0) {
                            uVar6 = 0x36;
                            goto LAB_0011b917;
                          }
                          uVar6 = local_130.buffer & 3;
                          local_130.buffer = local_130.buffer >> 2;
                          local_130.bp = local_130.bp + 2;
                          puVar16 = local_108 + ((uVar7 - 0x102) + (int)local_e8);
                          if (uVar7 < local_e0) {
                            puVar16 = bitlen_00 + (uVar7 - 1);
                          }
                          uVar11 = *puVar16;
                          puVar15 = (unsigned_short *)(ulong)uVar7;
                          iVar17 = -uVar7;
                          puVar16 = bitlen_00 + (long)puVar15;
                          iVar8 = uVar6 + 3;
                          do {
                            if (puVar14 <= puVar15) {
                              uVar7 = -iVar17;
                              local_fc = 0xd;
                              goto LAB_0011bf67;
                            }
                            puVar21 = local_108 + (uint)(iVar3 + (int)puVar15);
                            if (puVar15 < local_f8) {
                              puVar21 = puVar16;
                            }
                            *puVar21 = uVar11;
                            puVar15 = (unsigned_short *)((long)puVar15 + 1);
                            iVar17 = iVar17 + -1;
                            puVar16 = puVar16 + 1;
                            iVar8 = iVar8 + -1;
                          } while (iVar8 != 0);
                        }
                        uVar7 = -iVar17;
                      }
LAB_0011bf67:
                      if (local_130.bitsize < local_130.bp) {
                        uVar6 = 0x32;
                        goto LAB_0011b917;
                      }
                      uVar13 = local_130.bp;
                    } while (uVar7 < uVar12);
                    uVar6 = local_fc;
                    if (local_fc == 0) {
                      if (bitlen_00[0x100] == 0) {
                        uVar6 = 0x40;
                      }
                      else {
                        uVar6 = HuffmanTree_makeFromLengths(&local_88,bitlen_00,0x120,0xf);
                        puVar9 = local_108;
                        if (uVar6 == 0) {
                          uVar6 = HuffmanTree_makeFromLengths(&local_b8,local_108,0x20,0xf);
                        }
                      }
                    }
                  }
                }
                else {
                  bitlen_00 = (uint *)0x0;
                  puVar9 = (uint *)0x0;
                }
              }
LAB_0011b917:
              free(bitlen);
              free(bitlen_00);
              free(puVar9);
              HuffmanTree_cleanup(&local_58);
            }
          }
LAB_0011b93c:
          puVar4 = local_b8.table_len;
          if (uVar6 == 0) {
            local_f8 = local_88.table_value;
            local_108 = (uint *)local_b8.table_value;
            local_f0 = (HuffmanTree *)local_88.table_len;
            codetree = (HuffmanTree *)local_88.table_len;
            do {
              uVar13 = local_130.bp >> 3;
              if (uVar13 + 3 < local_130.size) {
                local_130.buffer = *(uint *)(local_130.data + uVar13);
              }
              else {
                local_130.buffer = 0;
                if (uVar13 < local_130.size) {
                  local_130.buffer = (uint)local_130.data[uVar13];
                }
                if (uVar13 + 1 < local_130.size) {
                  local_130.buffer = local_130.buffer | (uint)local_130.data[uVar13 + 1] << 8;
                }
                if (uVar13 + 2 < local_130.size) {
                  local_130.buffer = local_130.buffer | (uint)local_130.data[uVar13 + 2] << 0x10;
                }
              }
              local_130.buffer = local_130.buffer >> ((byte)local_130.bp & 7);
              uVar6 = huffmanDecodeSymbol(&local_130,codetree);
              if (uVar6 < 0x100) {
                uVar12 = ucvector_resize(out,out->size + 1);
                if (uVar12 == 0) {
                  uVar6 = 0x53;
                  goto LAB_0011b940;
                }
                out->data[out->size - 1] = (uchar)uVar6;
              }
              else {
                if ((uVar6 == 0x100) || (0x11d < uVar6)) {
                  uVar6 = (uint)(uVar6 != 0x100) << 4;
                  goto LAB_0011b940;
                }
                uVar20 = (ulong)(uVar6 - 0x101);
                uVar13 = (ulong)LENGTHBASE[uVar20];
                if (0xffffffffffffffeb < uVar20 - 0x1c) {
                  local_130.bp = local_130.bp + LENGTHEXTRA[uVar20];
                  uVar13 = uVar13 + (~(-1 << ((byte)LENGTHEXTRA[uVar20] & 0x1f)) & local_130.buffer)
                  ;
                }
                uVar20 = local_130.bp >> 3;
                bVar10 = (byte)local_130.bp;
                if (uVar20 + 4 < local_130.size) {
                  local_130.buffer =
                       ((uint)local_130.data[uVar20 + 4] << 0x18) << (8 - (bVar10 & 7) & 0x1f) |
                       *(uint *)(local_130.data + uVar20) >> (bVar10 & 7);
                }
                else {
                  local_130.buffer = 0;
                  if (uVar20 < local_130.size) {
                    local_130.buffer = (uint)local_130.data[uVar20];
                  }
                  if (uVar20 + 1 < local_130.size) {
                    local_130.buffer = local_130.buffer | (uint)local_130.data[uVar20 + 1] << 8;
                  }
                  if (uVar20 + 2 < local_130.size) {
                    local_130.buffer = local_130.buffer | (uint)local_130.data[uVar20 + 2] << 0x10;
                  }
                  if (uVar20 + 3 < local_130.size) {
                    local_130.buffer = local_130.buffer | (uint)local_130.data[uVar20 + 3] << 0x18;
                  }
                  local_130.buffer = local_130.buffer >> (bVar10 & 7);
                }
                uVar6 = huffmanDecodeSymbol(&local_130,(HuffmanTree *)puVar4);
                if (0x1d < uVar6) {
                  uVar6 = (uint)(uVar6 < 0x20) * 2 + 0x10;
                  goto LAB_0011b940;
                }
                uVar12 = DISTANCEBASE[uVar6];
                if (3 < uVar6) {
                  bVar10 = (byte)DISTANCEEXTRA[uVar6];
                  uVar7 = ~(-1 << (bVar10 & 0x1f)) & local_130.buffer;
                  local_130.buffer = local_130.buffer >> (bVar10 & 0x1f);
                  local_130.bp = local_130.bp + DISTANCEEXTRA[uVar6];
                  uVar12 = uVar12 + uVar7;
                }
                uVar20 = out->size;
                uVar18 = (ulong)uVar12;
                lVar19 = uVar20 - uVar18;
                if (uVar20 < uVar18) {
                  uVar6 = 0x34;
                  goto LAB_0011b940;
                }
                uVar6 = ucvector_resize(out,uVar20 + uVar13);
                codetree = local_f0;
                if (uVar6 == 0) {
                  uVar6 = 0x53;
                  goto LAB_0011b940;
                }
                lVar22 = uVar13 - uVar18;
                if (uVar13 < uVar18 || lVar22 == 0) {
                  if (uVar13 != 0) {
                    memcpy(out->data + uVar20,out->data + lVar19,uVar13);
                  }
                }
                else {
                  if (uVar18 != 0) {
                    memcpy(out->data + uVar20,out->data + lVar19,uVar18);
                  }
                  lVar23 = uVar20 + uVar18;
                  do {
                    puVar1 = out->data + lVar19;
                    lVar19 = lVar19 + 1;
                    out->data[lVar23] = *puVar1;
                    lVar23 = lVar23 + 1;
                    lVar22 = lVar22 + -1;
                    codetree = local_f0;
                  } while (lVar22 != 0);
                }
              }
            } while (local_130.bp <= local_130.bitsize);
            uVar6 = 0x33;
          }
        }
LAB_0011b940:
        HuffmanTree_cleanup(&local_88);
        HuffmanTree_cleanup(&local_b8);
      }
      uVar12 = local_dc & 1;
    } while (uVar6 == 0);
  }
  return uVar6;
}

Assistant:

static unsigned lodepng_inflatev(ucvector* out,
                                 const unsigned char* in, size_t insize,
                                 const LodePNGDecompressSettings* settings) {
  unsigned BFINAL = 0;
  LodePNGBitReader reader;
  unsigned error = LodePNGBitReader_init(&reader, in, insize);

  if(error) return error;

  while(!BFINAL) {
    unsigned BTYPE;
    if(!ensureBits9(&reader, 3)) return 52; /*error, bit pointer will jump past memory*/
    BFINAL = readBits(&reader, 1);
    BTYPE = readBits(&reader, 2);

    if(BTYPE == 3) return 20; /*error: invalid BTYPE*/
    else if(BTYPE == 0) error = inflateNoCompression(out, &reader, settings); /*no compression*/
    else error = inflateHuffmanBlock(out, &reader, BTYPE); /*compression, BTYPE 01 or 10*/

    if(error) return error;
  }

  return error;
}